

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_> * __thiscall
pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
def<Eigen::Matrix<double,1,5,1,1,5>(anurbs::BrepFaceField<5l>::*)(long)const,pybind11::arg>
          (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *this,
          char *name_,offset_in_Model_to_subr *f,arg *extra)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  handle local_c8;
  PyObject *local_c0;
  obj_attr_accessor local_b8;
  offset_in_Model_to_subr local_98;
  handle local_78;
  PyObject *local_70;
  handle local_68;
  handle local_60;
  undefined1 local_58 [16];
  is_method local_48;
  void *local_40;
  offset_in_Model_to_subr local_38;
  cpp_function local_30;
  cpp_function cf;
  arg *extra_local;
  offset_in_Model_to_subr *f_local;
  char *name__local;
  class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_> *this_local;
  
  local_40 = (void *)*f;
  local_38 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  f_00 = _anurbs__BrepFaceField<5l>___pybind11__method_adaptor<anurbs::BrepFaceField<5l>,Eigen::Matrix<double,1,5,1,1,5>,anurbs::BrepFaceField<5l>,long>_Eigen__Matrix<double,1,5,1,1,5>_anurbs__BrepFaceField<5l>_____long_const__
                   (local_40,local_38);
  pybind11::name::name((name *)&local_48,name_);
  is_method::is_method((is_method *)(local_58 + 8),(handle *)this);
  local_68.m_ptr = *(PyObject **)this;
  none::none((none *)&local_78);
  local_70 = local_78.m_ptr;
  getattr((pybind11 *)&local_60,local_68,name_,local_78);
  sibling::sibling((sibling *)local_58,&local_60);
  local_98 = f_00;
  cpp_function::
  cpp_function<Eigen::Matrix<double,1,5,1,1,5>,anurbs::BrepFaceField<5l>,long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            (&local_30,f_00,extra_00,&local_48,(sibling *)(local_58 + 8),(arg *)local_58);
  pybind11::object::~object((object *)&local_60);
  none::~none((none *)&local_78);
  cpp_function::name((cpp_function *)&local_c8);
  local_c0 = local_c8.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_b8,(object_api<pybind11::handle> *)this,local_c8);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_b8,&local_30);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_b8);
  pybind11::object::~object((object *)&local_c8);
  cpp_function::~cpp_function(&local_30);
  return (class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }